

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O3

void __thiscall
icu_63::DayPeriodRulesDataSink::setDayPeriodForHoursFromCutoffs
          (DayPeriodRulesDataSink *this,UErrorCode *errorCode)

{
  DayPeriod DVar1;
  undefined1 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  puVar2 = (undefined1 *)((long)this->ruleSetNum * 100 + *(long *)((anonymous_namespace)::data + 8))
  ;
  uVar3 = 0;
  do {
    uVar5 = this->cutoffs[uVar3];
    if ((uVar5 & 8) != 0) {
      if (uVar3 == 0 && this->period == DAYPERIOD_MIDNIGHT) {
        *puVar2 = 1;
      }
      else {
        if ((uVar3 != 0xc) || (this->period != DAYPERIOD_NOON)) {
LAB_002cd4a6:
          *errorCode = U_INVALID_FORMAT_ERROR;
          return;
        }
        puVar2[1] = 1;
      }
    }
    uVar4 = uVar3;
    if ((uVar5 & 6) != 0) {
      do {
        uVar4 = uVar4 + 1;
        if (uVar4 == uVar3) goto LAB_002cd4a6;
        if (uVar4 == 0x19) {
          uVar4 = 0;
        }
      } while ((this->cutoffs[(int)uVar4] & 1) == 0);
      if (uVar3 != uVar4) {
        DVar1 = this->period;
        uVar5 = uVar3;
        do {
          if (uVar5 == 0x18) {
            uVar5 = 0;
          }
          *(DayPeriod *)(puVar2 + (long)(int)uVar5 * 4 + 4) = DVar1;
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar4);
      }
    }
    if (0x17 < uVar3) {
      return;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void setDayPeriodForHoursFromCutoffs(UErrorCode &errorCode) {
        DayPeriodRules &rule = data->rules[ruleSetNum];

        for (int32_t startHour = 0; startHour <= 24; ++startHour) {
            // AT cutoffs must be either midnight or noon.
            if (cutoffs[startHour] & (1 << CUTOFF_TYPE_AT)) {
                if (startHour == 0 && period == DayPeriodRules::DAYPERIOD_MIDNIGHT) {
                    rule.fHasMidnight = TRUE;
                } else if (startHour == 12 && period == DayPeriodRules::DAYPERIOD_NOON) {
                    rule.fHasNoon = TRUE;
                } else {
                    errorCode = U_INVALID_FORMAT_ERROR;  // Bad data.
                    return;
                }
            }

            // FROM/AFTER and BEFORE must come in a pair.
            if (cutoffs[startHour] & (1 << CUTOFF_TYPE_FROM) ||
                    cutoffs[startHour] & (1 << CUTOFF_TYPE_AFTER)) {
                for (int32_t hour = startHour + 1;; ++hour) {
                    if (hour == startHour) {
                        // We've gone around the array once and can't find a BEFORE.
                        errorCode = U_INVALID_FORMAT_ERROR;
                        return;
                    }
                    if (hour == 25) { hour = 0; }
                    if (cutoffs[hour] & (1 << CUTOFF_TYPE_BEFORE)) {
                        rule.add(startHour, hour, period);
                        break;
                    }
                }
            }
        }
    }